

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O1

__string_type *
qclab::qasm2<double>
          (__string_type *__return_storage_ptr__,char *type,int qubit0,int qubit1,double angle)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  char buffer [32];
  stringstream stream;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  char local_1d8 [32];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (type == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar2 = strlen(type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,type,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
  iVar1 = sprintf(local_1d8,"%.15f",angle);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,local_1d8,local_1d8 + iVar1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1f8,local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") q[",4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,qubit0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], q[",5);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,qubit1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm2( const char type[] , const int qubit0 , const int qubit1 ,
                     const T angle ) {
    std::stringstream stream ;
    stream << type << "(" << qasm( angle ) << ") q[" << qubit0 << "], q["
                                                     << qubit1 << "];\n" ;
    return stream.str() ;
  }